

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall tinyusdz::Stage::allocate_prim_id(Stage *this,uint64_t *prim_id)

{
  bool bVar1;
  unsigned_long local_28;
  uint64_t val;
  uint64_t *prim_id_local;
  Stage *this_local;
  
  if (prim_id == (uint64_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    val = (uint64_t)prim_id;
    prim_id_local = (uint64_t *)this;
    bVar1 = HandleAllocator<unsigned_long>::Allocate(&this->_prim_id_allocator,&local_28);
    if (bVar1) {
      *(unsigned_long *)val = local_28;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Stage::allocate_prim_id(uint64_t *prim_id) const {
  if (!prim_id) {
    return false;
  }

  uint64_t val;
  if (_prim_id_allocator.Allocate(&val)) {
    (*prim_id) = val;
    return true;
  }

  return false;
}